

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_catalog_entry.cpp
# Opt level: O1

LogicalIndex __thiscall
duckdb::TableCatalogEntry::GetColumnIndex
          (TableCatalogEntry *this,string *column_name,bool if_exists)

{
  pointer pcVar1;
  LogicalIndex LVar2;
  BinderException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  LVar2 = ColumnList::GetColumnIndex(&this->columns,column_name);
  if (LVar2.index != 0xffffffffffffffff || if_exists) {
    return (LogicalIndex)LVar2.index;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Table \"%s\" does not have a column with name \"%s\"","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name._M_dataplus._M_p
  ;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,
             pcVar1 + (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                      _M_string_length);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (column_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + column_name->_M_string_length);
  BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_50,&local_70,&local_90);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

LogicalIndex TableCatalogEntry::GetColumnIndex(string &column_name, bool if_exists) const {
	auto entry = columns.GetColumnIndex(column_name);
	if (!entry.IsValid()) {
		if (if_exists) {
			return entry;
		}
		throw BinderException("Table \"%s\" does not have a column with name \"%s\"", name, column_name);
	}
	return entry;
}